

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::updateGeometryConstraints(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  int left;
  bool bVar1;
  byte bVar2;
  int top;
  QSize QVar3;
  long in_FS_OFFSET;
  int margin;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) goto LAB_00417f22;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QWidget::isMinimized(this_00);
  if (bVar1) {
LAB_00417e7d:
    QVar3 = (QSize)(**(code **)(*(long *)this_00 + 0x78))(this_00);
  }
  else {
    QVar3 = QWidget::minimumSize(this_00);
    if (QVar3 == (QSize)0x0) goto LAB_00417e7d;
    QVar3 = QWidget::minimumSize(this_00);
  }
  this->internalMinimumSize = QVar3;
  local_2c = -0x55555556;
  sizeParameters(this,&local_2c,&local_30);
  left = local_2c;
  top = titleBarHeight(this);
  QWidget::setContentsMargins(this_00,left,top,left,left);
  bVar1 = QWidget::isMaximized(this_00);
  if (bVar1) {
LAB_00417ed1:
    this->moveEnabled = false;
LAB_00417f12:
    bVar2 = false;
  }
  else {
    bVar1 = QWidget::isMinimized(this_00);
    if ((bVar1) && (*(char *)(*(long *)&this_00->field_0x8 + 0x2d4) == '\0')) goto LAB_00417ed1;
    this->moveEnabled = true;
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 0x100) != 0) goto LAB_00417f12;
    bVar2 = *(byte *)(*(long *)&this_00->field_0x8 + 0x2d4) ^ 1;
  }
  this->resizeEnabled = (bool)bVar2;
  updateDirtyRegions(this);
LAB_00417f22:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateGeometryConstraints()
{
    Q_Q(QMdiSubWindow);
    if (!parent)
        return;

    internalMinimumSize = (!q->isMinimized() && !q->minimumSize().isNull())
                          ? q->minimumSize() : q->minimumSizeHint();
    int margin, minWidth;
    sizeParameters(&margin, &minWidth);
    q->setContentsMargins(margin, titleBarHeight(), margin, margin);
    if (q->isMaximized() || (q->isMinimized() && !q->isShaded())) {
        moveEnabled = false;
        resizeEnabled = false;
    } else {
        moveEnabled = true;
        if ((q->windowFlags() & Qt::MSWindowsFixedSizeDialogHint) || q->isShaded())
            resizeEnabled = false;
        else
            resizeEnabled = true;
    }
    updateDirtyRegions();
}